

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O0

int mg_relationship_equal(mg_relationship *lhs,mg_relationship *rhs)

{
  long lVar1;
  mg_string *in_RSI;
  mg_map *in_RDI;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar2;
  
  lVar1._0_4_ = in_RDI->size;
  lVar1._4_4_ = in_RDI->capacity;
  if (((lVar1 == *(long *)in_RSI) && (in_RDI->keys == (mg_string **)in_RSI->data)) &&
     (in_RDI->values == *(mg_value ***)(in_RSI + 1))) {
    iVar2 = mg_string_equal(in_RSI,(mg_string *)0x111544);
    if (iVar2 == 0) {
      iVar2 = 0;
    }
    else {
      iVar2 = mg_map_equal((mg_map *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                           in_RDI);
    }
  }
  else {
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int mg_relationship_equal(const mg_relationship *lhs,
                          const mg_relationship *rhs) {
  if (lhs->id != rhs->id || lhs->start_id != rhs->start_id ||
      lhs->end_id != rhs->end_id) {
    return 0;
  }
  if (!mg_string_equal(lhs->type, rhs->type)) {
    return 0;
  }
  return mg_map_equal(lhs->properties, rhs->properties);
}